

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_peek_stream_info
          (aom_codec_iface_t *iface,uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si)

{
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  aom_codec_err_t res;
  aom_codec_err_t local_24;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) || (in_RCX == (undefined4 *)0x0)) {
    local_24 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *in_RCX = 0;
    in_RCX[1] = 0;
    local_24 = (**(code **)(in_RDI + 0x30))(in_RSI,in_RDX,in_RCX);
  }
  return local_24;
}

Assistant:

aom_codec_err_t aom_codec_peek_stream_info(aom_codec_iface_t *iface,
                                           const uint8_t *data, size_t data_sz,
                                           aom_codec_stream_info_t *si) {
  aom_codec_err_t res;

  if (!iface || !data || !data_sz || !si) {
    res = AOM_CODEC_INVALID_PARAM;
  } else {
    /* Set default/unknown values */
    si->w = 0;
    si->h = 0;

    res = iface->dec.peek_si(data, data_sz, si);
  }

  return res;
}